

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

char * glfwGetGamepadName(int jid)

{
  GLFWbool GVar1;
  int iVar2;
  uint in_EDI;
  _GLFWjoystick *js;
  undefined8 in_stack_fffffffffffffff8;
  _GLFWmapping *p_Var3;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    p_Var3 = (_GLFWmapping *)0x0;
  }
  else if (((int)in_EDI < 0) || (0xf < (int)in_EDI)) {
    _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)in_EDI);
    p_Var3 = (_GLFWmapping *)0x0;
  }
  else {
    GVar1 = initJoysticks();
    if (GVar1 == 0) {
      p_Var3 = (_GLFWmapping *)0x0;
    }
    else if (_glfw.joysticks[(int)in_EDI].present == 0) {
      p_Var3 = (_GLFWmapping *)0x0;
    }
    else {
      iVar2 = _glfwPlatformPollJoystick(js,iVar2);
      if (iVar2 == 0) {
        p_Var3 = (_GLFWmapping *)0x0;
      }
      else if (_glfw.joysticks[(int)in_EDI].mapping == (_GLFWmapping *)0x0) {
        p_Var3 = (_GLFWmapping *)0x0;
      }
      else {
        p_Var3 = _glfw.joysticks[(int)in_EDI].mapping;
      }
    }
  }
  return p_Var3->name;
}

Assistant:

GLFWAPI const char* glfwGetGamepadName(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return NULL;

    if (!js->mapping)
        return NULL;

    return js->mapping->name;
}